

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int panic(lua_State *L)

{
  undefined8 in_RDI;
  lua_State *unaff_retaddr;
  char *s;
  char *local_18;
  size_t *in_stack_fffffffffffffff0;
  
  local_18 = lua_tolstring(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffff0);
  fputs("PANIC: unprotected error in call to Lua API (",_stderr);
  if (local_18 == (char *)0x0) {
    local_18 = "?";
  }
  fputs(local_18,_stderr);
  fputc(0x29,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  return 0;
}

Assistant:

static int panic(lua_State *L)
{
  const char *s = lua_tostring(L, -1);
  fputs("PANIC: unprotected error in call to Lua API (", stderr);
  fputs(s ? s : "?", stderr);
  fputc(')', stderr); fputc('\n', stderr);
  fflush(stderr);
  return 0;
}